

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O0

taylor<double,_1,_2> *
operator/(taylor<double,_1,_2> *__return_storage_ptr__,int *x,taylor<double,_1,_2> *t)

{
  double *a;
  undefined1 local_30 [8];
  taylor<double,_1,_2> tmp;
  taylor<double,_1,_2> *t_local;
  int *x_local;
  
  tmp.super_polynomial<double,_1,_2>.c[2] = (double)t;
  taylor<double,_1,_2>::taylor((taylor<double,_1,_2> *)local_30);
  a = taylor<double,_1,_2>::operator[]
                ((taylor<double,_1,_2> *)tmp.super_polynomial<double,_1,_2>.c[2],0);
  inv_taylor<double,2>((taylor<double,_1,_2> *)local_30,a);
  taylor<double,_1,_2>::operator*=((taylor<double,_1,_2> *)local_30,*x);
  taylor<double,_1,_2>::taylor(__return_storage_ptr__);
  taylor<double,_1,_2>::compose<2>
            ((taylor<double,_1,_2> *)tmp.super_polynomial<double,_1,_2>.c[2],__return_storage_ptr__,
             (taylor<double,_1,_2> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator/(const S & x,
                                       const taylor<T, Nvar, Ndeg> & t) {
#ifdef TAYLOR_LOGGING
  if (taylor_logging)
    cout << "operator/ S templated. x = " << x << endl;
#endif
  taylor<T, 1, Ndeg> tmp;
  inv_taylor(tmp, t[0]);
  tmp *= x;
  taylor<T, Nvar, Ndeg> res;
  t.compose(res, tmp);
  return res;
}